

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O3

void RigidBodyDynamics::InverseDynamics
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDot,VectorNd *Tau,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  pointer pSVar16;
  pointer pSVar17;
  pointer pJVar18;
  pointer ppCVar19;
  pointer pSVar20;
  double *pdVar21;
  pointer pSVar22;
  pointer pMVar23;
  double *pdVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  void *pvVar44;
  pointer pBVar45;
  undefined8 *puVar46;
  pointer pBVar47;
  long lVar48;
  ulong uVar49;
  uint uVar50;
  long lVar51;
  ulong uVar52;
  SpatialTransform *pSVar53;
  pointer pSVar54;
  long lVar55;
  long lVar56;
  ulong uVar57;
  double dVar58;
  byte bVar59;
  VectorNd customJointQDDot;
  void *local_1f8;
  double dStack_1f0;
  double local_1e8;
  VectorNd *local_1e0;
  VectorNd *local_1d8;
  long local_1d0;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *local_1c8;
  ulong local_1c0;
  VectorNd *local_1b8;
  VectorNd *local_1b0;
  long local_1a8;
  long local_1a0;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  local_198;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  SpatialTransform local_168;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  bVar59 = 0;
  pSVar16 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  pSVar16 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar58 = (model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  dVar5 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar6 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(undefined8 *)
   &(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = -dVar5;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = -dVar6;
  *(double *)
   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = -dVar58;
  pBVar47 = (model->mBodies).
            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            .
            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar45 = (model->mBodies).
            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            .
            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_1e0 = QDDot;
  local_1d8 = Tau;
  local_1c8 = f_ext;
  local_1b8 = Q;
  local_1b0 = QDot;
  if (1 < (ulong)(((long)pBVar45 - (long)pBVar47 >> 4) * 0x6db6db6db6db6db7)) {
    uVar57 = 1;
    do {
      uVar50 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar57].q_index;
      uVar13 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar57];
      jcalc(model,(uint)uVar57,local_1b8,local_1b0);
      local_1a0 = uVar57 * 3;
      local_1d0 = uVar57 * 0x60;
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar57,
                 (model->v).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar13);
      pSVar16 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar17 = (model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_1a8 = uVar57 * 0x10;
      dVar58 = local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1] + *(double *)
                      ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      auVar25._8_4_ = SUB84(dVar58,0);
      auVar25._0_8_ =
           local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0] +
           *(double *)
            &pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      auVar25._12_4_ = (int)((ulong)dVar58 >> 0x20);
      *(undefined1 (*) [16])
       &pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar25;
      pdVar21 = (double *)
                ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar58 = local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [3] + pdVar21[1];
      auVar26._8_4_ = SUB84(dVar58,0);
      auVar26._0_8_ =
           local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[2] + *pdVar21;
      auVar26._12_4_ = (int)((ulong)dVar58 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar26;
      pdVar21 = (double *)
                ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar58 = local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [5] + pdVar21[1];
      auVar27._8_4_ = SUB84(dVar58,0);
      auVar27._0_8_ =
           local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[4] + *pdVar21;
      auVar27._12_4_ = (int)((ulong)dVar58 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar27;
      pSVar16 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar17 = (model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar58 = *(double *)
                ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar5 = *(double *)
               &pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      dVar6 = *(double *)
               ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      dVar7 = *(double *)
               ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
      dVar8 = *(double *)
               ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      pdVar21 = (double *)
                ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      dVar35 = *pdVar21;
      dVar36 = pdVar21[1];
      dVar9 = *(double *)
               &pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      dVar10 = *(double *)
                ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
      pdVar21 = (double *)
                ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar37 = *pdVar21;
      dVar38 = pdVar21[1];
      dVar11 = *(double *)
                ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
      pSVar16 = (model->c_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar17 = (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar12 = *(double *)
                ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      *(double *)
       &pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           dVar35 * -dVar58 + dVar6 * dVar36 +
           *(double *)
            &pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      *(double *)
       ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           dVar9 * dVar58 + -dVar5 * dVar36 + dVar12;
      pdVar21 = (double *)
                ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar12 = pdVar21[1];
      pdVar1 = (double *)
               ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar1 = dVar9 * -dVar6 + dVar35 * dVar5 + *pdVar21;
      pdVar1[1] = dVar38 * dVar6 + ((dVar36 * dVar8 - dVar7 * dVar35) - dVar58 * dVar37) + dVar12;
      pdVar21 = (double *)
                ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar6 = dVar5 * dVar37 + dVar11 * -dVar6 + dVar9 * -dVar8 + dVar10 * dVar35 + pdVar21[1];
      auVar28._8_4_ = SUB84(dVar6,0);
      auVar28._0_8_ =
           -dVar5 * dVar38 + dVar11 * dVar58 + dVar9 * dVar7 + -dVar10 * dVar36 + *pdVar21;
      auVar28._12_4_ = (int)((ulong)dVar6 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar28;
      pJVar18 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pJVar18[uVar57].mJointType == JointTypeCustom) {
        uVar14 = pJVar18[uVar57].custom_joint_index;
        ppCVar19 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_1f8 = (void *)0x0;
        dStack_1f0 = 0.0;
        dVar58 = (double)(ulong)*(uint *)(ppCVar19[uVar14] + 8);
        pvVar44 = local_1f8;
        local_1c0 = uVar57;
        if ((dVar58 != 0.0) && (pvVar44 = malloc((long)dVar58 * 8), pvVar44 == (void *)0x0)) {
          puVar46 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar46 = operator_new;
          __cxa_throw(puVar46,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_1f8 = pvVar44;
        uVar49 = (ulong)*(uint *)(ppCVar19[uVar14] + 8);
        if (uVar49 != 0) {
          pdVar21 = (local_1e0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          uVar52 = 0;
          do {
            *(double *)((long)local_1f8 + uVar52 * 8) = pdVar21[uVar50 + (int)uVar52];
            uVar52 = uVar52 + 1;
          } while (uVar49 != uVar52);
        }
        dStack_1f0 = dVar58;
        Math::SpatialTransform::apply
                  ((SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                   local_1d0),
                   (model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar13);
        uVar49 = local_1c0;
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[2] =
             (double)((model->c).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar57);
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[4] =
             (double)((model->mCustomJoints).
                      super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14] + 0x70);
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[5] = (double)&local_1f8;
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] = (double)&local_198;
        SpatialVector_t::operator=
                  ((model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar57,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                    *)&local_168);
        free(local_1f8);
      }
      else {
        uVar49 = uVar57;
        if (pJVar18[uVar57].mDoFCount == 3) {
          Math::SpatialTransform::apply
                    ((SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     local_1d0),
                     (model->a).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13);
          local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[4] =
               (double)((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar57);
          local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[2] =
               (double)((model->c).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar57);
          pdVar21 = (local_1e0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          local_1f8 = (void *)pdVar21[uVar50];
          dStack_1f0 = pdVar21[uVar50 + 1];
          local_1e8 = pdVar21[uVar50 + 2];
          local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[5] = (double)&local_1f8;
          local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1] = (double)&local_198;
          SpatialVector_t::operator=
                    ((model->a).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar57,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)&local_168);
        }
        else if (pJVar18[uVar57].mDoFCount == 1) {
          Math::SpatialTransform::apply
                    ((SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     local_1d0),
                     (model->a).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13);
          pSVar16 = (model->c).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar17 = (model->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar20 = (model->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_48 = (local_1e0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[uVar50];
          dVar58 = *(double *)
                    ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar5 = *(double *)
                   ((long)&pSVar20[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          *(double *)
           &pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
               *(double *)
                &pSVar20[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * local_48 +
               local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [0] + *(double *)
                      &pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          *(double *)
           ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
               dVar5 * local_48 +
               local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1] + dVar58;
          pdVar21 = (double *)
                    ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar58 = pdVar21[1];
          pdVar1 = (double *)
                   ((long)&pSVar20[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar5 = pdVar1[1];
          pdVar2 = (double *)
                   ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          *pdVar2 = *pdVar1 * local_48 +
                    local_168.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] + *pdVar21;
          pdVar2[1] = dVar5 * local_48 +
                      local_168.E.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[3] + dVar58;
          pdVar21 = (double *)
                    ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          pdVar1 = (double *)
                   ((long)&pSVar20[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar58 = local_48 * pdVar1[1] +
                   local_168.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[5] + pdVar21[1];
          auVar34._8_4_ = SUB84(dVar58,0);
          auVar34._0_8_ =
               local_48 * *pdVar1 +
               local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [4] + *pdVar21;
          auVar34._12_4_ = (int)((ulong)dVar58 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar17[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar34;
        }
      }
      pBVar47 = (model->mBodies).
                super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                .
                super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pBVar47[uVar57].mIsVirtual == false) {
        lVar48 = local_1a8 * 5;
        Math::SpatialRigidBodyInertia::operator*
                  ((SpatialRigidBodyInertia *)
                   ((long)&(((model->I).
                             super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                             ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                   lVar48 + -8),
                   (model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar57);
        pSVar16 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialRigidBodyInertia::operator*
                  ((SpatialRigidBodyInertia *)
                   ((long)&(((model->I).
                             super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                             ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                   lVar48 + -8),pSVar16 + uVar57);
        dVar58 = *(double *)
                  ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = *(double *)
                 &pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        dVar6 = *(double *)
                 ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar7 = *(double *)
                 ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
        dVar8 = *(double *)
                 ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar9 = *(double *)
                 ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
        pSVar16 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *(double *)
         &pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             dVar8 * dStack_170 +
             local_178 * -dVar7 + -dVar58 * (double)local_198.m_rhs + dVar6 * local_188 +
             local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[0];
        *(double *)
         ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             -dVar9 * dStack_170 +
             dStack_180 * dVar7 + dVar58 * (double)local_198.m_lhs.m_matrix + -dVar5 * local_188 +
             local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[1];
        pdVar21 = (double *)
                  ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar21 = local_178 * dVar9 +
                   (((double)local_198.m_rhs * dVar5 - dVar6 * (double)local_198.m_lhs.m_matrix) -
                   dVar8 * dStack_180) +
                   local_168.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[2];
        pdVar21[1] = local_178 * -dVar58 + dStack_170 * dVar6 +
                     local_168.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[3];
        pdVar21 = (double *)
                  ((long)&pSVar16[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar21 = dStack_180 * dVar58 + -dVar5 * dStack_170 +
                   local_168.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[4];
        pdVar21[1] = dStack_180 * -dVar6 + dVar5 * local_178 +
                     local_168.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[5];
        pBVar47 = (model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        pSVar16 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar48 = local_1a0 * 0x10;
        puVar46 = (undefined8 *)
                  ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                  lVar48 + 0x20);
        *puVar46 = 0;
        puVar46[1] = 0;
        puVar46 = (undefined8 *)
                  ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                  lVar48 + 0x10);
        *puVar46 = 0;
        puVar46[1] = 0;
        puVar46 = (undefined8 *)
                  ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar48);
        *puVar46 = 0;
        puVar46[1] = 0;
      }
      uVar57 = (ulong)((int)uVar49 + 1);
      pBVar45 = (model->mBodies).
                super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                .
                super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar49 = ((long)pBVar45 - (long)pBVar47 >> 4) * 0x6db6db6db6db6db7;
    } while (uVar57 <= uVar49 && uVar49 - uVar57 != 0);
  }
  uVar57 = ((long)pBVar45 - (long)pBVar47 >> 4) * 0x6db6db6db6db6db7;
  if ((local_1c8 != (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x0) &&
     (1 < uVar57)) {
    uVar49 = 1;
    uVar50 = 2;
    do {
      Math::SpatialTransform::operator*
                (&local_168,
                 (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar49,
                 (model->X_base).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar49]);
      pSVar22 = (model->X_base).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar53 = &local_168;
      pSVar54 = pSVar22 + uVar49;
      for (lVar48 = 9; lVar48 != 0; lVar48 = lVar48 + -1) {
        *(double *)&(pSVar54->E).super_Matrix3d =
             (pSVar53->E).super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
        pSVar53 = (SpatialTransform *)((long)pSVar53 + (ulong)bVar59 * -0x10 + 8);
        pSVar54 = (pointer)((long)pSVar54 + ((ulong)bVar59 * -2 + 1) * 8);
      }
      *(double *)((long)&pSVar22[uVar49].r.super_Vector3d + 0x10) =
           local_168.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
      *(double *)
       &pSVar22[uVar49].r.super_Vector3d.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
           local_168.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
      *(double *)
       ((long)&pSVar22[uVar49].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
           local_168.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
      Math::SpatialTransform::toMatrixAdjoint
                ((SpatialMatrix *)&local_168,
                 (model->X_base).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar49);
      pSVar16 = (local_1c8->
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar17 = (model->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar5 = *(double *)
               &pSVar16[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      dVar6 = *(double *)
               ((long)&pSVar16[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      dVar7 = *(double *)
               ((long)&pSVar16[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar8 = *(double *)
               ((long)&pSVar16[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
      pdVar21 = (double *)
                ((long)&pSVar16[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar9 = *pdVar21;
      dVar10 = pdVar21[1];
      dVar58 = *(double *)
                ((long)&pSVar17[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) -
               (dStack_70 * dVar10 +
               dStack_a0 * dVar9 +
               dStack_d0 * dVar8 +
               dStack_100 * dVar7 +
               local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [7] * dVar6 +
               local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1] * dVar5);
      auVar29._8_4_ = SUB84(dVar58,0);
      auVar29._0_8_ =
           *(double *)
            &pSVar17[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> -
           (local_78 * dVar10 +
           local_a8 * dVar9 +
           local_d8 * dVar8 +
           local_108 * dVar7 +
           local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[6] * dVar6 +
           local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0] * dVar5);
      auVar29._12_4_ = (int)((ulong)dVar58 >> 0x20);
      *(undefined1 (*) [16])
       &pSVar17[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar29;
      pdVar21 = (double *)
                ((long)&pSVar17[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar58 = pdVar21[1] -
               (dStack_60 * dVar10 +
               dStack_90 * dVar9 +
               dStack_c0 * dVar8 +
               dStack_f0 * dVar7 +
               local_168.r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] * dVar6 +
               local_168.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [3] * dVar5);
      pdVar1 = (double *)
               ((long)&pSVar17[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar11 = *pdVar1;
      dVar12 = pdVar1[1];
      auVar30._8_4_ = SUB84(dVar58,0);
      auVar30._0_8_ =
           *pdVar21 -
           (local_68 * dVar10 +
           local_98 * dVar9 +
           local_c8 * dVar8 +
           local_f8 * dVar7 +
           local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[8] * dVar6 +
           local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[2] * dVar5);
      auVar30._12_4_ = (int)((ulong)dVar58 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar17[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar30;
      pdVar21 = (double *)
                ((long)&pSVar17[uVar49].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar21 = dVar11 - (dVar10 * local_58 +
                          dVar9 * local_88 +
                          dVar8 * local_b8 +
                          dVar7 * local_e8 +
                          dVar6 * local_168.r.super_Vector3d.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1] +
                          dVar5 * local_168.E.super_Matrix3d.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[4]);
      pdVar21[1] = dVar12 - (dVar10 * dStack_50 +
                            dVar9 * dStack_80 +
                            dVar8 * dStack_b0 +
                            dVar7 * dStack_e0 +
                            dVar6 * local_168.r.super_Vector3d.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2] +
                            dVar5 * local_168.E.super_Matrix3d.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[5]);
      uVar49 = (ulong)uVar50;
      uVar57 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar50 = uVar50 + 1;
    } while (uVar49 <= uVar57 && uVar57 - uVar49 != 0);
  }
  uVar50 = (int)uVar57 - 1;
  if (uVar50 != 0) {
    uVar57 = (ulong)uVar50;
    lVar48 = uVar57 * 0xc + 8;
    lVar51 = uVar57 * 0x30;
    lVar56 = uVar57 * 0x24 + 0x20;
    lVar55 = uVar57 * 0x60;
    do {
      uVar49 = uVar57 - 1;
      pJVar18 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)pJVar18 + lVar48 * 2 + -8) == 0x15) {
        uVar50 = *(uint *)((long)&pJVar18->mJointAxes + lVar48 * 2 + 4);
        ppCVar19 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_198.m_lhs.m_matrix = (non_const_type)(ppCVar19[uVar50] + 0x70);
        local_198.m_rhs =
             (RhsNested)
             ((long)&(((model->f).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar51);
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[4] =
             (double)(ulong)*(uint *)((long)&pJVar18->mJointAxes + lVar48 * 2);
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] = (double)(ulong)*(uint *)(ppCVar19[uVar50] + 8);
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] =
             (double)((local_1d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data +
                     (long)local_168.E.super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[4]);
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[6] =
             (double)(local_1d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[2] = 4.94065645841247e-324;
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[3] = (double)local_1d8;
        local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[5] = 0.0;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)&local_168,
                   &local_198,(assign_op<double,_double> *)&local_1f8,(type)0x0);
      }
      else {
        iVar15 = *(int *)((long)pJVar18 + lVar48 * 2 + -4);
        if (iVar15 == 3) {
          pMVar23 = (model->multdof3_S).
                    super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar16 = (model->f).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar52 = (ulong)*(uint *)((long)&pJVar18->mJointAxes + lVar48 * 2);
          pdVar24 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          pdVar21 = (double *)
                    ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar51);
          dVar58 = *pdVar21;
          dVar5 = pdVar21[1];
          pdVar21 = (double *)
                    ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                    lVar51 + 0x10);
          dVar6 = *pdVar21;
          dVar7 = pdVar21[1];
          pdVar21 = (double *)
                    ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                    lVar51 + 0x20);
          dVar8 = *pdVar21;
          dVar9 = pdVar21[1];
          pdVar1 = (double *)
                   ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar56 * 4 + -0x80);
          pdVar2 = (double *)
                   ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar56 * 4 + -0x70);
          pdVar3 = (double *)
                   ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar56 * 4 + -0x60);
          pdVar21 = (double *)
                    ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar56 * 4 + -0x50);
          dVar10 = *pdVar21;
          dVar11 = pdVar21[1];
          pdVar21 = (double *)
                    ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar56 * 4 + -0x40);
          dVar12 = *pdVar21;
          dVar35 = pdVar21[1];
          pdVar21 = (double *)
                    ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar56 * 4 + -0x30);
          dVar36 = *pdVar21;
          dVar37 = pdVar21[1];
          pdVar21 = (double *)
                    ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar56 * 4 + -0x20);
          dVar38 = *pdVar21;
          dVar39 = pdVar21[1];
          pdVar21 = (double *)
                    ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar56 * 4 + -0x10);
          dVar40 = *pdVar21;
          dVar41 = pdVar21[1];
          pdVar21 = (double *)
                    ((long)&(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar56 * 4);
          dVar42 = *pdVar21;
          dVar43 = pdVar21[1];
          pdVar21 = pdVar24 + uVar52;
          *pdVar21 = pdVar3[1] * dVar9 + pdVar2[1] * dVar7 + pdVar1[1] * dVar5 +
                     *pdVar3 * dVar8 + *pdVar2 * dVar6 + *pdVar1 * dVar58;
          pdVar21[1] = dVar37 * dVar9 + dVar35 * dVar7 + dVar11 * dVar5 +
                       dVar36 * dVar8 + dVar12 * dVar6 + dVar10 * dVar58;
          pdVar24[uVar52 + 2] =
               dVar9 * dVar43 + dVar7 * dVar41 + dVar5 * dVar39 +
               dVar8 * dVar42 + dVar6 * dVar40 + dVar58 * dVar38;
        }
        else if (iVar15 == 1) {
          pSVar16 = (model->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar17 = (model->f).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar21 = (double *)
                    ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar51);
          pdVar2 = (double *)
                   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar51 + 0x10);
          pdVar3 = (double *)
                   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar51 + 0x20);
          pdVar1 = (double *)
                   ((long)&(pSVar17->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar51);
          pdVar24 = (double *)
                    ((long)&(pSVar17->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                    lVar51 + 0x10);
          pdVar4 = (double *)
                   ((long)&(pSVar17->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar51 + 0x20);
          (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_data[*(uint *)((long)&pJVar18->mJointAxes + lVar48 * 2)] =
               pdVar3[1] * pdVar4[1] + pdVar2[1] * pdVar24[1] + pdVar21[1] * pdVar1[1] +
               *pdVar3 * *pdVar4 + *pdVar2 * *pdVar24 + *pdVar21 * *pdVar1;
        }
      }
      uVar52 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar57];
      if (uVar52 != 0) {
        pSVar16 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar55)
                   ,(SpatialVector *)
                    ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar51));
        uVar50 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar57];
        pSVar17 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar58 = *(double *)
                  ((long)&pSVar16[uVar52].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                 local_168.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1];
        auVar31._8_4_ = SUB84(dVar58,0);
        auVar31._0_8_ =
             *(double *)
              &pSVar16[uVar52].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
             local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[0];
        auVar31._12_4_ = (int)((ulong)dVar58 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar17[uVar50].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar31;
        pdVar21 = (double *)
                  ((long)&pSVar16[uVar52].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar58 = pdVar21[1] +
                 local_168.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [3];
        auVar32._8_4_ = SUB84(dVar58,0);
        auVar32._0_8_ =
             *pdVar21 +
             local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[2];
        auVar32._12_4_ = (int)((ulong)dVar58 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar17[uVar50].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar32;
        pdVar21 = (double *)
                  ((long)&pSVar16[uVar52].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar58 = pdVar21[1] +
                 local_168.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [5];
        auVar33._8_4_ = SUB84(dVar58,0);
        auVar33._0_8_ =
             *pdVar21 +
             local_168.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[4];
        auVar33._12_4_ = (int)((ulong)dVar58 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar17[uVar50].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar33;
      }
      lVar48 = lVar48 + -0xc;
      lVar51 = lVar51 + -0x30;
      lVar56 = lVar56 + -0x24;
      lVar55 = lVar55 + -0x60;
      uVar57 = uVar49;
    } while ((int)uVar49 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void InverseDynamics (
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    const VectorNd &QDDot,
    VectorNd &Tau,
    std::vector<SpatialVector> *f_ext) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].set (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    jcalc (model, i, Q, QDot);

    model.v[i] = model.X_lambda[i].apply(model.v[lambda]) + model.v_J[i];
    model.c[i] = model.c_J[i] + crossm(model.v[i],model.v_J[i]);

    if(model.mJoints[i].mJointType != JointTypeCustom){
      if (model.mJoints[i].mDoFCount == 1) {
        model.a[i] =  model.X_lambda[i].apply(model.a[lambda])
          + model.c[i]
          + model.S[i] * QDDot[q_index];
      } else if (model.mJoints[i].mDoFCount == 3) {
        model.a[i] =  model.X_lambda[i].apply(model.a[lambda])
          + model.c[i]
          + model.multdof3_S[i] * Vector3d (QDDot[q_index],
              QDDot[q_index + 1],
              QDDot[q_index + 2]);
      }
    }else if(model.mJoints[i].mJointType == JointTypeCustom){
      unsigned int k = model.mJoints[i].custom_joint_index;
      VectorNd customJointQDDot(model.mCustomJoints[k]->mDoFCount);
      for(unsigned z = 0; z < model.mCustomJoints[k]->mDoFCount; ++z){
        customJointQDDot[z] = QDDot[q_index+z];
      }
      model.a[i] =  model.X_lambda[i].apply(model.a[lambda])
        + model.c[i]
        + model.mCustomJoints[k]->S * customJointQDDot;
    }

    if (!model.mBodies[i].mIsVirtual) {
      model.f[i] = model.I[i] * model.a[i] + crossf(model.v[i],model.I[i] * model.v[i]);
    } else {
      model.f[i].setZero();
    }
  }

  if (f_ext != NULL) {
    for (unsigned int i = 1; i < model.mBodies.size(); i++) {
      unsigned int lambda = model.lambda[i];
      model.X_base[i] = model.X_lambda[i] * model.X_base[lambda];
      model.f[i] -= model.X_base[i].toMatrixAdjoint() * (*f_ext)[i];
    }
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if(model.mJoints[i].mJointType != JointTypeCustom){
      if (model.mJoints[i].mDoFCount == 1) {
        Tau[model.mJoints[i].q_index] = model.S[i].dot(model.f[i]);
      } else if (model.mJoints[i].mDoFCount == 3) {
        Tau.block<3,1>(model.mJoints[i].q_index, 0)
          = model.multdof3_S[i].transpose() * model.f[i];
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {  
      unsigned int k = model.mJoints[i].custom_joint_index;
      Tau.block(model.mJoints[i].q_index,0,
          model.mCustomJoints[k]->mDoFCount, 1)
        = model.mCustomJoints[k]->S.transpose() * model.f[i];
    }

    if (model.lambda[i] != 0) {
      model.f[model.lambda[i]] = model.f[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.f[i]);
    }
  }
}